

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O3

iterator * __thiscall
ft::deque<int,_ft::allocator<int>_>::erase
          (iterator *__return_storage_ptr__,deque<int,_ft::allocator<int>_> *this,iterator *first,
          iterator *last)

{
  iterator *piVar1;
  pointer pvVar2;
  size_type sVar3;
  pointer pvVar4;
  _func_int **pp_Var5;
  map_pointer ppvVar6;
  map_pointer ppvVar7;
  _func_int **val;
  undefined1 local_108 [8];
  deque<int,_ft::allocator<int>_> tmp;
  dequeIterator<int,_64UL> local_68;
  iterator *local_40;
  allocator_type local_31;
  
  tmp._112_8_ = &PTR__dequeIterator_00112d38;
  local_68._vptr_dequeIterator = (_func_int **)&PTR__dequeIterator_00112d38;
  if (&this->m_finish != &local_68) {
    local_68.m_cur = (this->m_finish).m_cur;
    local_68.m_first = (this->m_finish).m_first;
    local_68.m_last = (this->m_finish).m_last;
    local_68.m_node = (this->m_finish).m_node;
  }
  local_40 = __return_storage_ptr__;
  deque<int,ft::allocator<int>>::deque<ft::dequeIterator<int,64ul>>
            ((deque<int,ft::allocator<int>> *)local_108,(dequeIterator<int,_64UL> *)&tmp.field_0x70,
             &local_68,&local_31,(type *)0x0);
  pvVar2 = (this->m_finish).m_cur;
  if (first->m_cur != pvVar2) {
    pvVar4 = (this->m_finish).m_first;
    sVar3 = this->m_size;
    ppvVar6 = (this->m_finish).m_node;
    do {
      ppvVar7 = ppvVar6;
      if (pvVar2 == pvVar4) {
        ppvVar7 = ppvVar6 + -1;
        (this->m_finish).m_node = ppvVar7;
        pvVar4 = ppvVar6[-1];
        (this->m_finish).m_first = pvVar4;
        pvVar2 = pvVar4 + 0x40;
        (this->m_finish).m_last = pvVar2;
      }
      pvVar2 = pvVar2 + -1;
      (this->m_finish).m_cur = pvVar2;
      sVar3 = sVar3 - 1;
      ppvVar6 = ppvVar7;
    } while (first->m_cur != pvVar2);
    this->m_size = sVar3;
  }
  pp_Var5 = (_func_int **)tmp.m_start.m_first;
  val = tmp.m_start._vptr_dequeIterator;
  pvVar2 = tmp.m_start.m_last;
  if (tmp.m_start._vptr_dequeIterator != tmp.m_finish._vptr_dequeIterator) {
    do {
      push_back(this,(value_type_conflict *)val);
      val = (_func_int **)((long)val + 4);
      if (val == pp_Var5) {
        val = *(_func_int ***)(pvVar2 + 2);
        pvVar2 = pvVar2 + 2;
        pp_Var5 = val + 0x20;
      }
    } while (val != tmp.m_finish._vptr_dequeIterator);
  }
  piVar1 = local_40;
  local_40->_vptr_dequeIterator = (_func_int **)&PTR__dequeIterator_00112d38;
  if (first != local_40) {
    local_40->m_cur = first->m_cur;
    local_40->m_first = first->m_first;
    local_40->m_last = first->m_last;
    local_40->m_node = first->m_node;
  }
  ~deque((deque<int,_ft::allocator<int>_> *)local_108);
  return piVar1;
}

Assistant:

iterator	erase(iterator first, iterator last) {
		deque	tmp(last, this->end());
		while (first != this->end())
			this->pop_back();
		for (iterator it = tmp.begin(); it != tmp.end(); ++it)
			this->push_back(*it);
		return first;
	}